

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void __thiscall
DensityCalculator<long_double,_float>::push_bdens_fast_route
          (DensityCalculator<long_double,_float> *this,double split_point,size_t col)

{
  reference pvVar1;
  size_type in_RSI;
  long in_RDI;
  longdouble lVar2;
  unkbyte10 in_ST1;
  unkbyte10 in_ST4;
  undefined4 uVar3;
  double dVar4;
  undefined4 uVar5;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  longdouble fraction_right;
  longdouble fraction_left;
  longdouble curr_range;
  undefined2 uVar6;
  undefined6 in_stack_ffffffffffffff12;
  value_type_conflict3 *__x;
  undefined2 uVar7;
  undefined6 in_stack_ffffffffffffff22;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 uVar8;
  undefined6 uVar9;
  undefined2 in_stack_ffffffffffffff36;
  
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x60),in_RSI);
  uVar8 = SUB104((longdouble)*pvVar1,0);
  uVar9 = (undefined6)((unkuint10)(longdouble)*pvVar1 >> 0x20);
  std::vector<double,_std::allocator<double>_>::operator[]
            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x48),in_RSI);
  std::vector<double,_std::allocator<double>_>::operator[]
            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x48),in_RSI);
  std::vector<double,_std::allocator<double>_>::operator[]
            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x60),in_RSI);
  dVar4 = std::numeric_limits<double>::min();
  std::fmax(dVar4,(double)CONCAT44(in_XMM1_Db,in_XMM1_Da));
  dVar4 = std::numeric_limits<double>::epsilon();
  uVar3 = SUB84(dVar4,0);
  uVar5 = (undefined4)((ulong)dVar4 >> 0x20);
  dVar4 = std::fmin(1.0 - dVar4,dVar4);
  uVar6 = (undefined2)((unkuint10)in_ST1 >> 0x40);
  std::log(dVar4);
  std::vector<long_double,_std::allocator<long_double>_>::back
            ((vector<long_double,_std::allocator<long_double>_> *)
             CONCAT62(in_stack_ffffffffffffff12,uVar6));
  dVar4 = std::numeric_limits<double>::min();
  std::fmax(dVar4,(double)CONCAT44(uVar5,uVar3));
  dVar4 = std::numeric_limits<double>::epsilon();
  lVar2 = (longdouble)(1.0 - dVar4);
  __x = SUB108(lVar2,0);
  uVar7 = (undefined2)((unkuint10)lVar2 >> 0x40);
  dVar4 = std::fmin(1.0 - dVar4,dVar4);
  uVar6 = (undefined2)((unkuint10)in_ST4 >> 0x40);
  std::log(dVar4);
  std::vector<long_double,_std::allocator<long_double>_>::back
            ((vector<long_double,_std::allocator<long_double>_> *)
             CONCAT62(in_stack_ffffffffffffff12,uVar6));
  std::vector<long_double,_std::allocator<long_double>_>::push_back
            ((vector<long_double,_std::allocator<long_double>_> *)
             CONCAT62(in_stack_ffffffffffffff22,uVar7),__x);
  std::vector<long_double,_std::allocator<long_double>_>::push_back
            ((vector<long_double,_std::allocator<long_double>_> *)
             CONCAT62(in_stack_ffffffffffffff22,uVar7),__x);
  push_bdens_internal((DensityCalculator<long_double,_float> *)
                      CONCAT26(in_stack_ffffffffffffff36,uVar9),
                      (double)CONCAT44(uVar8,in_stack_ffffffffffffff28),
                      CONCAT62(in_stack_ffffffffffffff22,uVar7));
  return;
}

Assistant:

void DensityCalculator<ldouble_safe, real_t>::push_bdens_fast_route(double split_point, size_t col)
{
    ldouble_safe curr_range = (ldouble_safe)this->box_high[col] - (ldouble_safe)this->box_low[col];
    ldouble_safe fraction_left  =  ((ldouble_safe)split_point - (ldouble_safe)this->box_low[col]) / curr_range;
    ldouble_safe fraction_right = ((ldouble_safe)this->box_high[col] - (ldouble_safe)split_point) / curr_range;
    fraction_left   = std::fmax(fraction_left, (ldouble_safe)std::numeric_limits<double>::min());
    fraction_left   = std::fmin(fraction_left, (ldouble_safe)(1. - std::numeric_limits<double>::epsilon()));
    fraction_left   = std::log(fraction_left);
    fraction_left  += this->multipliers.back();
    fraction_right  = std::fmax(fraction_right, (ldouble_safe)std::numeric_limits<double>::min());
    fraction_right  = std::fmin(fraction_right, (ldouble_safe)(1. - std::numeric_limits<double>::epsilon()));
    fraction_right  = std::log(fraction_right);
    fraction_right += this->multipliers.back();
    this->multipliers.push_back(fraction_right);
    this->multipliers.push_back(fraction_left);

    this->push_bdens_internal(split_point, col);
}